

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hash.cpp
# Opt level: O3

IdentPtr __thiscall
HashTbl::PidHashNameLenWithHash<unsigned_char>
          (HashTbl *this,uchar *prgch,uchar *end,int32 cch,uint32 luHash)

{
  code *pcVar1;
  bool bVar2;
  ULONG UVar3;
  undefined4 *puVar4;
  IdentPtr pIVar5;
  uint uVar6;
  IdentPtr pIVar7;
  int cb;
  uchar *local_48;
  LPCUTF8 local_40;
  uchar *local_38;
  
  local_38 = end;
  if (cch < 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                       ,0x104,"(cch >= 0)","cch >= 0");
    if (!bVar2) goto LAB_00e627ea;
    *puVar4 = 0;
  }
  if (prgch == (uchar *)0x0 && cch != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                       ,0x105,"(cch == 0 || prgch != nullptr)","cch == 0 || prgch != nullptr");
    if (!bVar2) goto LAB_00e627ea;
    *puVar4 = 0;
  }
  UVar3 = CaseSensitiveComputeHash(prgch,local_38);
  if (UVar3 != luHash) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Hash.cpp"
                       ,0x106,"(luHash == CaseSensitiveComputeHash(prgch, end))",
                       "luHash == CaseSensitiveComputeHash(prgch, end)");
    if (!bVar2) {
LAB_00e627ea:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  uVar6 = this->m_luMask & luHash;
  pIVar5 = this->m_prgpidName[uVar6];
  local_40 = prgch;
  if (pIVar5 == (IdentPtr)0x0) {
    pIVar7 = (IdentPtr)(this->m_prgpidName + uVar6);
    uVar6 = 0;
  }
  else {
    uVar6 = 0;
    do {
      pIVar7 = pIVar5;
      if (((pIVar7->m_luHash == luHash) && (pIVar7->m_cch == cch)) &&
         (bVar2 = utf8::CharsAreEqual((LPCOLESTR)&pIVar7->field_0x22,local_40,local_38,
                                      doAllowThreeByteSurrogates), bVar2)) {
        return pIVar7;
      }
      uVar6 = uVar6 + 1;
      pIVar5 = pIVar7->m_pidNext;
    } while (pIVar7->m_pidNext != (Ident *)0x0);
    if ((5 < uVar6) && (this->m_luMask < this->m_luCount)) {
      Grow(this);
      pIVar5 = (IdentPtr)(this->m_prgpidName + (this->m_luMask & luHash));
      do {
        pIVar7 = pIVar5;
        pIVar5 = pIVar7->m_pidNext;
      } while (pIVar7->m_pidNext != (Ident *)0x0);
    }
  }
  if (this->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(this->stats,uVar6 + 1);
  }
  if ((((uint)cch < 0x7fffffeb) && (cb = cch * 2 + 0x2a, -1 < cb)) &&
     (pIVar5 = (IdentPtr)NoReleaseAllocator::Alloc(&this->m_noReleaseAllocator,cb),
     pIVar5 != (IdentPtr)0x0)) {
    pIVar7->m_pidNext = pIVar5;
    this->m_luCount = this->m_luCount + 1;
    pIVar5->m_pidNext = (Ident *)0x0;
    pIVar5->m_pidRefStack = (PidRefStack *)0x0;
    pIVar5->m_tk = 0x90;
    pIVar5->m_grfid = 0;
    pIVar5->m_luHash = luHash;
    pIVar5->m_cch = cch;
    pIVar5->m_propertyId = -1;
    pIVar5->assignmentState = NotAssigned;
    pIVar5->isUsedInLdElem = false;
    local_48 = local_40;
    utf8::DecodeUnitsIntoAndNullTerminate
              ((char16 *)&pIVar5->field_0x22,&local_48,local_38,doDefault,(bool *)0x0);
    return pIVar5;
  }
  OutOfMemory();
}

Assistant:

IdentPtr HashTbl::PidHashNameLenWithHash(_In_reads_(cch) CharType const * prgch, CharType const * end, int32 cch, uint32 luHash)
{
    Assert(cch >= 0);
    Assert(cch == 0 || prgch != nullptr);
    Assert(luHash == CaseSensitiveComputeHash(prgch, end));

    IdentPtr * ppid = nullptr;
    IdentPtr pid;
    LONG cb;
    int32 bucketCount;


#if PROFILE_DICTIONARY
    int depth = 0;
#endif

    pid = this->FindExistingPid(prgch, end, cch, luHash, &ppid, &bucketCount
#if PROFILE_DICTIONARY
                                , depth
#endif
        );
    if (pid)
    {
        return pid;
    }

    if (bucketCount > BucketLengthLimit && m_luCount > m_luMask)
    {
        Grow();

        // ppid is now invalid because the Grow() moves the entries around.
        // Find the correct ppid by repeating the find of the end of the bucket
        // the new item will be placed in.
        // Note this is similar to the main find loop but does not count nor does it
        // look at the entries because we already proved above the entry is not in the
        // table, we just want to find the end of the bucket.
        ppid = &m_prgpidName[luHash & m_luMask];
        while (*ppid)
            ppid = &(*ppid)->m_pidNext;
    }


#if PROFILE_DICTIONARY
    ++depth;
    if (stats)
        stats->Insert(depth);
#endif

    //Windows OS Bug 1795286 : CENTRAL PREFAST RUN: inetcore\scriptengines\src\src\core\hash.cpp :
    //               'sizeof((*pid))+((cch+1))*sizeof(OLECHAR)' may be smaller than
    //               '((cch+1))*sizeof(OLECHAR)'. This can be caused by integer overflows
    //               or underflows. This could yield an incorrect buffer all
    /* Allocate space for the identifier */
    ULONG Len;

    if (FAILED(ULongAdd(cch, 1, &Len)) ||
        FAILED(ULongMult(Len, sizeof(OLECHAR), &Len)) ||
        FAILED(ULongAdd(Len, sizeof(*pid), &Len)) ||
        FAILED(ULongToLong(Len, &cb)))
    {
        cb = 0;
        OutOfMemory();
    }


    if (nullptr == (pid = (IdentPtr)m_noReleaseAllocator.Alloc(cb)))
        OutOfMemory();

    /* Insert the identifier into the hash list */
    *ppid = pid;

    // Increment the number of entries in the table.
    m_luCount++;

    /* Fill in the identifier record */
    pid->m_pidNext = nullptr;
    pid->m_tk = tkLim;
    pid->m_grfid = fidNil;
    pid->m_luHash = luHash;
    pid->m_cch = cch;
    pid->m_pidRefStack = nullptr;
    pid->m_propertyId = Js::Constants::NoProperty;
    pid->assignmentState = NotAssigned;
    pid->isUsedInLdElem = false;

    HashTbl::CopyString(pid->m_sz, prgch, end);

    return pid;
}